

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::util_IsHex::test_method(util_IsHex *this)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  bool bVar1;
  long in_FS_OFFSET;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffff938;
  undefined7 in_stack_fffffffffffff940;
  undefined1 in_stack_fffffffffffff947;
  assertion_result *in_stack_fffffffffffff948;
  char *in_stack_fffffffffffff950;
  const_string *__str;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff958;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  const_string *in_stack_fffffffffffff960;
  const_string *msg;
  lazy_ostream *in_stack_fffffffffffff968;
  const_string *in_stack_fffffffffffff970;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffff978;
  unit_test_log_t *this_01;
  const_string local_558 [2];
  assertion_result local_508;
  const_string local_4f0;
  basic_string_view<char,_std::char_traits<char>_> local_4e0;
  const_string local_4d0 [2];
  lazy_ostream local_4b0 [3];
  assertion_result local_480;
  unit_test_log_t local_458 [2];
  const_string local_448 [2];
  lazy_ostream local_428 [3];
  assertion_result local_3f8 [2];
  const_string local_3c0 [2];
  lazy_ostream local_3a0 [3];
  assertion_result local_370 [2];
  const_string local_338 [2];
  lazy_ostream local_318 [3];
  assertion_result local_2e8 [2];
  const_string local_2b0 [2];
  lazy_ostream local_290 [3];
  assertion_result local_260 [2];
  const_string local_228 [2];
  lazy_ostream local_208 [3];
  assertion_result local_1d8 [2];
  const_string local_1a0 [2];
  lazy_ostream local_180 [3];
  assertion_result local_150 [2];
  const_string local_118 [2];
  lazy_ostream local_f8 [3];
  assertion_result local_c8 [2];
  const_string local_90 [2];
  lazy_ostream local_70 [3];
  assertion_result local_40 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff978,in_stack_fffffffffffff970,(size_t)in_stack_fffffffffffff968
               ,in_stack_fffffffffffff960);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    str._M_str = (char *)in_stack_fffffffffffff968;
    str._M_len = (size_t)in_stack_fffffffffffff960;
    IsHex(str);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff948,(bool)in_stack_fffffffffffff947);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (basic_cstring<const_char> *)in_stack_fffffffffffff938);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    in_stack_fffffffffffff938 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_40,local_70,local_90,0x1c0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff938);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff938);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff978,in_stack_fffffffffffff970,(size_t)in_stack_fffffffffffff968
               ,in_stack_fffffffffffff960);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    str_00._M_str = (char *)in_stack_fffffffffffff968;
    str_00._M_len = (size_t)in_stack_fffffffffffff960;
    IsHex(str_00);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff948,(bool)in_stack_fffffffffffff947);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (basic_cstring<const_char> *)in_stack_fffffffffffff938);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    in_stack_fffffffffffff938 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c8,local_f8,local_118,0x1c1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff938);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff938);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff978,in_stack_fffffffffffff970,(size_t)in_stack_fffffffffffff968
               ,in_stack_fffffffffffff960);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    str_01._M_str = (char *)in_stack_fffffffffffff968;
    str_01._M_len = (size_t)in_stack_fffffffffffff960;
    IsHex(str_01);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff948,(bool)in_stack_fffffffffffff947);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (basic_cstring<const_char> *)in_stack_fffffffffffff938);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    in_stack_fffffffffffff938 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_150,local_180,local_1a0,0x1c2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff938);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff938);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff978,in_stack_fffffffffffff970,(size_t)in_stack_fffffffffffff968
               ,in_stack_fffffffffffff960);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    str_02._M_str = (char *)in_stack_fffffffffffff968;
    str_02._M_len = (size_t)in_stack_fffffffffffff960;
    IsHex(str_02);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff948,(bool)in_stack_fffffffffffff947);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (basic_cstring<const_char> *)in_stack_fffffffffffff938);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    in_stack_fffffffffffff938 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1d8,local_208,local_228,0x1c3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff938);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff938);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff978,in_stack_fffffffffffff970,(size_t)in_stack_fffffffffffff968
               ,in_stack_fffffffffffff960);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    str_03._M_str = (char *)in_stack_fffffffffffff968;
    str_03._M_len = (size_t)in_stack_fffffffffffff960;
    IsHex(str_03);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff948,(bool)in_stack_fffffffffffff947);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (basic_cstring<const_char> *)in_stack_fffffffffffff938);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    in_stack_fffffffffffff938 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_260,local_290,local_2b0,0x1c5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff938);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff938);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff978,in_stack_fffffffffffff970,(size_t)in_stack_fffffffffffff968
               ,in_stack_fffffffffffff960);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    str_04._M_str = (char *)in_stack_fffffffffffff968;
    str_04._M_len = (size_t)in_stack_fffffffffffff960;
    IsHex(str_04);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff948,(bool)in_stack_fffffffffffff947);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (basic_cstring<const_char> *)in_stack_fffffffffffff938);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    in_stack_fffffffffffff938 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2e8,local_318,local_338,0x1c6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff938);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff938);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff978,in_stack_fffffffffffff970,(size_t)in_stack_fffffffffffff968
               ,in_stack_fffffffffffff960);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    str_05._M_str = (char *)in_stack_fffffffffffff968;
    str_05._M_len = (size_t)in_stack_fffffffffffff960;
    IsHex(str_05);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff948,(bool)in_stack_fffffffffffff947);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (basic_cstring<const_char> *)in_stack_fffffffffffff938);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    in_stack_fffffffffffff938 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_370,local_3a0,local_3c0,0x1c7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff938);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff938);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff978,in_stack_fffffffffffff970,(size_t)in_stack_fffffffffffff968
               ,in_stack_fffffffffffff960);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    str_06._M_str = (char *)in_stack_fffffffffffff968;
    str_06._M_len = (size_t)in_stack_fffffffffffff960;
    IsHex(str_06);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff948,(bool)in_stack_fffffffffffff947);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (basic_cstring<const_char> *)in_stack_fffffffffffff938);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    in_stack_fffffffffffff938 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3f8,local_428,local_448,0x1c8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff938);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff938);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this_01 = local_458;
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_01,file,(size_t)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    str_07._M_str = (char *)in_stack_fffffffffffff968;
    str_07._M_len = (size_t)in_stack_fffffffffffff960;
    IsHex(str_07);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff948,(bool)in_stack_fffffffffffff947);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (basic_cstring<const_char> *)in_stack_fffffffffffff938);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    in_stack_fffffffffffff938 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_480,local_4b0,local_4d0,0x1c9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff938);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff938);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this_00 = &local_4e0;
    __str = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    msg = &local_4f0;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_01,file,(size_t)in_stack_fffffffffffff968,msg);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,(char *)__str);
    str_08._M_str = (char *)in_stack_fffffffffffff968;
    str_08._M_len = (size_t)msg;
    IsHex(str_08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff948,(bool)in_stack_fffffffffffff947);
    in_stack_fffffffffffff968 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (basic_cstring<const_char> *)in_stack_fffffffffffff938);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff948,
               (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               (unsigned_long)in_stack_fffffffffffff938);
    in_stack_fffffffffffff938 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_508,(lazy_ostream *)&stack0xfffffffffffffac8,local_558,0x1ca,CHECK,CHECK_PRED)
    ;
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff938);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff938);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(util_IsHex)
{
    BOOST_CHECK(IsHex("00"));
    BOOST_CHECK(IsHex("00112233445566778899aabbccddeeffAABBCCDDEEFF"));
    BOOST_CHECK(IsHex("ff"));
    BOOST_CHECK(IsHex("FF"));

    BOOST_CHECK(!IsHex(""));
    BOOST_CHECK(!IsHex("0"));
    BOOST_CHECK(!IsHex("a"));
    BOOST_CHECK(!IsHex("eleven"));
    BOOST_CHECK(!IsHex("00xx00"));
    BOOST_CHECK(!IsHex("0x0000"));
}